

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeadersConfig.h
# Opt level: O2

void __thiscall jaegertracing::propagation::HeadersConfig::HeadersConfig(HeadersConfig *this)

{
  allocator local_94;
  allocator local_93;
  allocator local_92;
  allocator local_91;
  string local_90;
  string local_70;
  string local_50;
  string local_30;
  
  std::__cxx11::string::string((string *)&local_30,"",&local_91);
  std::__cxx11::string::string((string *)&local_50,"",&local_92);
  std::__cxx11::string::string((string *)&local_70,"",&local_93);
  std::__cxx11::string::string((string *)&local_90,"",&local_94);
  HeadersConfig(this,&local_30,&local_50,&local_70,&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

HeadersConfig()
        : HeadersConfig("", "", "", "")
    {
    }